

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printBlock(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  Ref local_18;
  Ref node_local;
  
  local_18.inst = node.inst;
  if ((node.inst)->type == Array) {
    if (((((node.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
        usedElements != 1) {
      pRVar2 = Ref::operator[](&local_18,1);
      if (pRVar2->inst->type != Array) goto LAB_00d21ae2;
      if ((((pRVar2->inst->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements != 0) {
        maybeSpace(this,'{');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '{';
        this->indent = this->indent + 1;
        newline(this);
        pRVar2 = Ref::operator[](&local_18,1);
        printStats(this,pRVar2->inst);
        this->indent = this->indent + -1;
        newline(this);
        emit(this,'}');
        return;
      }
    }
    emit(this,"{}");
    return;
  }
LAB_00d21ae2:
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printBlock(Ref node) {
    if (node->size() == 1 || node[1]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[1]);
    indent--;
    newline();
    emit('}');
  }